

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O2

int alsa_stream_init_single
              (cubeb_conflict1 *ctx,cubeb_stream_conflict1 **stream,char *stream_name,
              snd_pcm_stream_t stream_type,cubeb_devid deviceid,cubeb_stream_params *stream_params,
              uint latency_frames,cubeb_data_callback_conflict1 data_callback,
              cubeb_state_callback_conflict1 state_callback,void *user_ptr)

{
  pthread_mutex_t *__mutex;
  snd_pcm_format_t sVar1;
  snd_pcm_uframes_t sVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  cubeb_stream_conflict1 *stm;
  size_t __size;
  char *pcVar8;
  pollfd *ppVar9;
  long lVar10;
  undefined4 in_register_0000000c;
  undefined4 in_stack_0000000c;
  snd_pcm_uframes_t period_size;
  
  pcVar8 = "default";
  if ((char *)CONCAT44(in_register_0000000c,stream_type) != (char *)0x0) {
    pcVar8 = (char *)CONCAT44(in_register_0000000c,stream_type);
  }
  if ((ctx == (cubeb_conflict1 *)0x0) || (stream == (cubeb_stream_conflict1 **)0x0)) {
    __assert_fail("ctx && stream",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_alsa.c"
                  ,0x3dd,
                  "int alsa_stream_init_single(cubeb *, cubeb_stream **, const char *, snd_pcm_stream_t, cubeb_devid, cubeb_stream_params *, unsigned int, cubeb_data_callback, cubeb_state_callback, void *)"
                 );
  }
  *stream = (cubeb_stream_conflict1 *)0x0;
  if ((*(byte *)((long)deviceid + 0x10) & 1) == 0) {
    iVar5 = -2;
    if ((ulong)*deviceid < 4) {
      sVar1 = *(snd_pcm_format_t *)(&DAT_00122910 + (ulong)*deviceid * 4);
      __mutex = &ctx->mutex;
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      if (ctx->active_streams < 0x10) {
        ctx->active_streams = ctx->active_streams + 1;
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        stm = (cubeb_stream_conflict1 *)calloc(1,0x118);
        if (stm == (cubeb_stream_conflict1 *)0x0) {
          __assert_fail("stm",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_alsa.c"
                        ,0x3ff,
                        "int alsa_stream_init_single(cubeb *, cubeb_stream **, const char *, snd_pcm_stream_t, cubeb_devid, cubeb_stream_params *, unsigned int, cubeb_data_callback, cubeb_state_callback, void *)"
                       );
        }
        stm->context = ctx;
        stm->data_callback =
             (cubeb_data_callback_conflict1)CONCAT44(in_stack_0000000c,latency_frames);
        stm->state_callback = (cubeb_state_callback_conflict1)data_callback;
        stm->user_ptr = state_callback;
        uVar3 = *deviceid;
        uVar4 = *(undefined8 *)((long)deviceid + 8);
        (stm->params).format = (int)uVar3;
        (stm->params).rate = (int)((ulong)uVar3 >> 0x20);
        (stm->params).channels = (int)uVar4;
        (stm->params).layout = (int)((ulong)uVar4 >> 0x20);
        (stm->params).prefs = *(cubeb_stream_prefs *)((long)deviceid + 0x10);
        stm->volume = 1.0;
        stm->stream_type = (snd_pcm_stream_t)stream_name;
        iVar5 = pthread_mutex_init((pthread_mutex_t *)&stm->mutex,(pthread_mutexattr_t *)0x0);
        if (iVar5 != 0) {
          __assert_fail("r == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_alsa.c"
                        ,0x40e,
                        "int alsa_stream_init_single(cubeb *, cubeb_stream **, const char *, snd_pcm_stream_t, cubeb_devid, cubeb_stream_params *, unsigned int, cubeb_data_callback, cubeb_state_callback, void *)"
                       );
        }
        iVar5 = pthread_cond_init((pthread_cond_t *)&stm->cond,(pthread_condattr_t *)0x0);
        if (iVar5 != 0) {
          __assert_fail("r == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_alsa.c"
                        ,0x411,
                        "int alsa_stream_init_single(cubeb *, cubeb_stream **, const char *, snd_pcm_stream_t, cubeb_devid, cubeb_stream_params *, unsigned int, cubeb_data_callback, cubeb_state_callback, void *)"
                       );
        }
        iVar5 = alsa_locked_pcm_open(&stm->pcm,pcVar8,stm->stream_type,ctx->local_config);
        if (-1 < iVar5) {
          iVar5 = (*cubeb_snd_pcm_nonblock)(stm->pcm,1);
          if (iVar5 != 0) {
            __assert_fail("r == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_alsa.c"
                          ,0x41b,
                          "int alsa_stream_init_single(cubeb *, cubeb_stream **, const char *, snd_pcm_stream_t, cubeb_devid, cubeb_stream_params *, unsigned int, cubeb_data_callback, cubeb_state_callback, void *)"
                         );
          }
          uVar7 = (stm->params).rate;
          uVar6 = (uint)(((double)((ulong)stream_params & 0xffffffff) * 1000000.0) / (double)uVar7);
          if (((ctx->local_config == (snd_config_t *)0x0) && (ctx->is_pa != 0)) &&
             ((int)uVar6 < 0x7a121)) {
            uVar6 = 500000;
          }
          iVar5 = (*cubeb_snd_pcm_set_params)
                            (stm->pcm,sVar1,SND_PCM_ACCESS_RW_INTERLEAVED,(stm->params).channels,
                             uVar7,1,uVar6);
          if (iVar5 < 0) {
            alsa_stream_destroy(stm);
            return -2;
          }
          iVar5 = (*cubeb_snd_pcm_get_params)(stm->pcm,&stm->buffer_size,&period_size);
          if (iVar5 != 0) {
            __assert_fail("r == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_alsa.c"
                          ,0x430,
                          "int alsa_stream_init_single(cubeb *, cubeb_stream **, const char *, snd_pcm_stream_t, cubeb_devid, cubeb_stream_params *, unsigned int, cubeb_data_callback, cubeb_state_callback, void *)"
                         );
          }
          sVar2 = stm->buffer_size * 2;
          stm->buffer_size = sVar2;
          __size = (*cubeb_snd_pcm_frames_to_bytes)(stm->pcm,sVar2);
          pcVar8 = (char *)calloc(1,__size);
          stm->buffer = pcVar8;
          if (pcVar8 == (char *)0x0) {
            __assert_fail("stm->buffer",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_alsa.c"
                          ,0x437,
                          "int alsa_stream_init_single(cubeb *, cubeb_stream **, const char *, snd_pcm_stream_t, cubeb_devid, cubeb_stream_params *, unsigned int, cubeb_data_callback, cubeb_state_callback, void *)"
                         );
          }
          uVar7 = (*cubeb_snd_pcm_poll_descriptors_count)(stm->pcm);
          stm->nfds = (long)(int)uVar7;
          if (uVar7 == 0) {
            __assert_fail("stm->nfds > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_alsa.c"
                          ,0x43a,
                          "int alsa_stream_init_single(cubeb *, cubeb_stream **, const char *, snd_pcm_stream_t, cubeb_devid, cubeb_stream_params *, unsigned int, cubeb_data_callback, cubeb_state_callback, void *)"
                         );
          }
          ppVar9 = (pollfd *)calloc((long)(int)uVar7,8);
          stm->saved_fds = ppVar9;
          if (ppVar9 == (pollfd *)0x0) {
            __assert_fail("stm->saved_fds",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_alsa.c"
                          ,0x43d,
                          "int alsa_stream_init_single(cubeb *, cubeb_stream **, const char *, snd_pcm_stream_t, cubeb_devid, cubeb_stream_params *, unsigned int, cubeb_data_callback, cubeb_state_callback, void *)"
                         );
          }
          iVar5 = (*cubeb_snd_pcm_poll_descriptors)(stm->pcm,ppVar9,uVar7);
          if (stm->nfds != (long)iVar5) {
            __assert_fail("(nfds_t)r == stm->nfds",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_alsa.c"
                          ,0x43f,
                          "int alsa_stream_init_single(cubeb *, cubeb_stream **, const char *, snd_pcm_stream_t, cubeb_devid, cubeb_stream_params *, unsigned int, cubeb_data_callback, cubeb_state_callback, void *)"
                         );
          }
          pthread_mutex_lock((pthread_mutex_t *)__mutex);
          for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
            if (ctx->streams[lVar10] == (cubeb_stream_conflict1 *)0x0) {
              ctx->streams[lVar10] = stm;
              pthread_mutex_unlock((pthread_mutex_t *)__mutex);
              *stream = stm;
              return 0;
            }
          }
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        }
        alsa_stream_destroy(stm);
      }
      else {
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      }
      iVar5 = -1;
    }
  }
  else {
    iVar5 = -4;
  }
  return iVar5;
}

Assistant:

static int
alsa_stream_init_single(cubeb * ctx, cubeb_stream ** stream,
                        char const * stream_name, snd_pcm_stream_t stream_type,
                        cubeb_devid deviceid,
                        cubeb_stream_params * stream_params,
                        unsigned int latency_frames,
                        cubeb_data_callback data_callback,
                        cubeb_state_callback state_callback, void * user_ptr)
{
  (void)stream_name;
  cubeb_stream * stm;
  int r;
  snd_pcm_format_t format;
  snd_pcm_uframes_t period_size;
  int latency_us = 0;
  char const * pcm_name =
      deviceid ? (char const *)deviceid : CUBEB_ALSA_PCM_NAME;

  assert(ctx && stream);

  *stream = NULL;

  if (stream_params->prefs & CUBEB_STREAM_PREF_LOOPBACK) {
    return CUBEB_ERROR_NOT_SUPPORTED;
  }

  switch (stream_params->format) {
  case CUBEB_SAMPLE_S16LE:
    format = SND_PCM_FORMAT_S16_LE;
    break;
  case CUBEB_SAMPLE_S16BE:
    format = SND_PCM_FORMAT_S16_BE;
    break;
  case CUBEB_SAMPLE_FLOAT32LE:
    format = SND_PCM_FORMAT_FLOAT_LE;
    break;
  case CUBEB_SAMPLE_FLOAT32BE:
    format = SND_PCM_FORMAT_FLOAT_BE;
    break;
  default:
    return CUBEB_ERROR_INVALID_FORMAT;
  }

  pthread_mutex_lock(&ctx->mutex);
  if (ctx->active_streams >= CUBEB_STREAM_MAX) {
    pthread_mutex_unlock(&ctx->mutex);
    return CUBEB_ERROR;
  }
  ctx->active_streams += 1;
  pthread_mutex_unlock(&ctx->mutex);

  stm = calloc(1, sizeof(*stm));
  assert(stm);

  stm->context = ctx;
  stm->data_callback = data_callback;
  stm->state_callback = state_callback;
  stm->user_ptr = user_ptr;
  stm->params = *stream_params;
  stm->state = INACTIVE;
  stm->volume = 1.0;
  stm->buffer = NULL;
  stm->bufframes = 0;
  stm->stream_type = stream_type;
  stm->other_stream = NULL;

  r = pthread_mutex_init(&stm->mutex, NULL);
  assert(r == 0);

  r = pthread_cond_init(&stm->cond, NULL);
  assert(r == 0);

  r = alsa_locked_pcm_open(&stm->pcm, pcm_name, stm->stream_type,
                           ctx->local_config);
  if (r < 0) {
    alsa_stream_destroy(stm);
    return CUBEB_ERROR;
  }

  r = WRAP(snd_pcm_nonblock)(stm->pcm, 1);
  assert(r == 0);

  latency_us = latency_frames * 1e6 / stm->params.rate;

  /* Ugly hack: the PA ALSA plugin allows buffer configurations that can't
     possibly work.  See https://bugzilla.mozilla.org/show_bug.cgi?id=761274.
     Only resort to this hack if the handle_underrun workaround failed. */
  if (!ctx->local_config && ctx->is_pa) {
    const int min_latency = 5e5;
    latency_us = latency_us < min_latency ? min_latency : latency_us;
  }

  r = WRAP(snd_pcm_set_params)(stm->pcm, format, SND_PCM_ACCESS_RW_INTERLEAVED,
                               stm->params.channels, stm->params.rate, 1,
                               latency_us);
  if (r < 0) {
    alsa_stream_destroy(stm);
    return CUBEB_ERROR_INVALID_FORMAT;
  }

  r = WRAP(snd_pcm_get_params)(stm->pcm, &stm->buffer_size, &period_size);
  assert(r == 0);

  /* Double internal buffer size to have enough space when waiting for the other
   * side of duplex connection */
  stm->buffer_size *= 2;
  stm->buffer =
      calloc(1, WRAP(snd_pcm_frames_to_bytes)(stm->pcm, stm->buffer_size));
  assert(stm->buffer);

  stm->nfds = WRAP(snd_pcm_poll_descriptors_count)(stm->pcm);
  assert(stm->nfds > 0);

  stm->saved_fds = calloc(stm->nfds, sizeof(struct pollfd));
  assert(stm->saved_fds);
  r = WRAP(snd_pcm_poll_descriptors)(stm->pcm, stm->saved_fds, stm->nfds);
  assert((nfds_t)r == stm->nfds);

  if (alsa_register_stream(ctx, stm) != 0) {
    alsa_stream_destroy(stm);
    return CUBEB_ERROR;
  }

  *stream = stm;

  return CUBEB_OK;
}